

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Arguments *in_RSI;
  Arguments args;
  int busy_waiting;
  int connection;
  char **in_stack_00000028;
  int in_stack_00000034;
  char *in_stack_00000038;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffec;
  int connection_00;
  
  iVar1 = check_flag(in_stack_00000038,in_stack_00000034,in_stack_00000028);
  parse_arguments(in_RSI,in_stack_ffffffffffffffec,
                  (char **)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  connection_00 = (int)((ulong)in_RSI >> 0x20);
  iVar2 = create_connection(0);
  communicate(connection_00,(Arguments *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffe4);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	// File descriptor for the socket over which
	// the communciation will happen with the client
	int connection;

	// Flag to determine whether or not to
	// do busy-waiting and non-blocking calls
	int busy_waiting;

	// For command-line arguments
	struct Arguments args;

	busy_waiting = check_flag("busy", argc, argv);
	parse_arguments(&args, argc, argv);

	connection = create_connection(busy_waiting);
	communicate(connection, &args, busy_waiting);

	return EXIT_SUCCESS;
}